

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gz_init(gz_statep state)

{
  int iVar1;
  uchar *puVar2;
  z_streamp strm;
  int ret;
  gz_statep state_local;
  
  puVar2 = (uchar *)malloc((ulong)(state->want << 1));
  state->in = puVar2;
  if (state->in == (uchar *)0x0) {
    cm_zlib_gz_error(state,-4,"out of memory");
    return -1;
  }
  if (state->direct == 0) {
    puVar2 = (uchar *)malloc((ulong)state->want);
    state->out = puVar2;
    if (state->out == (uchar *)0x0) {
      free(state->in);
      cm_zlib_gz_error(state,-4,"out of memory");
      return -1;
    }
    (state->strm).zalloc = (alloc_func)0x0;
    (state->strm).zfree = (free_func)0x0;
    (state->strm).opaque = (voidpf)0x0;
    iVar1 = cm_zlib_deflateInit2_(&state->strm,state->level,8,0x1f,8,state->strategy,"1.3.1",0x70);
    if (iVar1 != 0) {
      free(state->out);
      free(state->in);
      cm_zlib_gz_error(state,-4,"out of memory");
      return -1;
    }
    (state->strm).next_in = (Bytef *)0x0;
  }
  state->size = state->want;
  if (state->direct == 0) {
    (state->strm).avail_out = state->size;
    (state->strm).next_out = state->out;
    (state->x).next = (state->strm).next_out;
  }
  return 0;
}

Assistant:

local int gz_init(gz_statep state) {
    int ret;
    z_streamp strm = &(state->strm);

    /* allocate input buffer (double size for gzprintf) */
    state->in = (unsigned char *)malloc(state->want << 1);
    if (state->in == NULL) {
        gz_error(state, Z_MEM_ERROR, "out of memory");
        return -1;
    }

    /* only need output buffer and deflate state if compressing */
    if (!state->direct) {
        /* allocate output buffer */
        state->out = (unsigned char *)malloc(state->want);
        if (state->out == NULL) {
            free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }

        /* allocate deflate memory, set up for gzip compression */
        strm->zalloc = Z_NULL;
        strm->zfree = Z_NULL;
        strm->opaque = Z_NULL;
        ret = deflateInit2(strm, state->level, Z_DEFLATED,
                           MAX_WBITS + 16, DEF_MEM_LEVEL, state->strategy);
        if (ret != Z_OK) {
            free(state->out);
            free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        strm->next_in = NULL;
    }

    /* mark state as initialized */
    state->size = state->want;

    /* initialize write buffer if compressing */
    if (!state->direct) {
        strm->avail_out = state->size;
        strm->next_out = state->out;
        state->x.next = strm->next_out;
    }
    return 0;
}